

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

sunrealtype N_VDotProd_Serial(N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
                      *(double *)(*(long *)((long)y->content + 0x10) + lVar2 * 8);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

sunrealtype N_VDotProd_Serial(N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype sum, *xd, *yd;

  sum = ZERO;
  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  for (i = 0; i < N; i++) { sum += xd[i] * yd[i]; }

  return (sum);
}